

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

string * __thiscall google::StrError_abi_cxx11_(string *__return_storage_ptr__,google *this,int err)

{
  int iVar1;
  allocator<char> local_79;
  char buf [100];
  
  iVar1 = posix_strerror_r((int)this,buf,100);
  if ((iVar1 < 0) || (buf[0] == '\0')) {
    snprintf(buf,100,"Error number %d",(ulong)this & 0xffffffff);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,buf,&local_79)
  ;
  return __return_storage_ptr__;
}

Assistant:

GLOG_NO_EXPORT
string StrError(int err) {
  char buf[100];
  int rc = posix_strerror_r(err, buf, sizeof(buf));
  if ((rc < 0) || (buf[0] == '\000')) {
    std::snprintf(buf, sizeof(buf), "Error number %d", err);
  }
  return buf;
}